

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Pointer.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,PointerType *ptrTy)

{
  ostream *poVar1;
  
  if (ptrTy != (PointerType *)0x0) {
    std::operator<<(os,"<PointerType | ");
    poVar1 = std::operator<<(os," referenced-type:");
    operator<<(poVar1,*(Type **)((ptrTy->super_Type).impl_._M_t.
                                 super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                                 .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>.
                                 _M_head_impl + 2));
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<PointerType is null>");
  return poVar1;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const PointerType* ptrTy)
{
    if (!ptrTy)
        return os << "<PointerType is null>";
    os << "<PointerType | ";
    os << " referenced-type:" << ptrTy->referencedType();
    os << ">";
    return os;
}